

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::StrictEqualString(Var aLeft,JavascriptString *aRight)

{
  bool bVar1;
  JavascriptString *aLeft_00;
  uint uVar2;
  
  bVar1 = VarIs<Js::JavascriptString>(aLeft);
  uVar2 = 0;
  if (bVar1) {
    aLeft_00 = UnsafeVarTo<Js::JavascriptString>(aLeft);
    uVar2 = 0;
    if (aLeft_00 != (JavascriptString *)0x0) {
      bVar1 = JavascriptString::Equals(aLeft_00,aRight);
      uVar2 = (uint)bVar1;
    }
  }
  return uVar2;
}

Assistant:

BOOL JavascriptOperators::StrictEqualString(Var aLeft, JavascriptString* aRight)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_StrictEqualString);
        JIT_HELPER_SAME_ATTRIBUTES(Op_StrictEqualString, Op_StrictEqual);

        JavascriptString* leftStr = TryFromVar<JavascriptString>(aLeft);
        if (!leftStr)
        {
            return false;
        }
        JIT_HELPER_REENTRANT_HEADER(Op_StrictEqualString);
        JIT_HELPER_SAME_ATTRIBUTES(Op_StrictEqualString, Op_StrictEqual);
        return JavascriptString::Equals(leftStr, aRight);
        JIT_HELPER_END(Op_StrictEqualString);
    }